

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeInstUse(DefUseManager *this,Instruction *inst)

{
  uint uVar1;
  iterator __position;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  pointer puVar2;
  pointer pOVar3;
  iterator iVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  Instruction *this_01;
  long lVar8;
  uint32_t use_id;
  uint local_4c;
  Instruction *local_48;
  UserEntry local_40;
  
  local_48 = inst;
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            std::__detail::
            _Map_base<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->inst_to_used_ids_,&local_48);
  puVar2 = *(pointer *)this_00;
  puVar5 = *(pointer *)(this_00 + 8);
  if (puVar5 != puVar2) {
    EraseUseRecordsOfOperandIds(this,local_48);
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
              std::__detail::
              _Map_base<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->inst_to_used_ids_,&local_48);
    puVar2 = *(pointer *)this_00;
    puVar5 = *(pointer *)(this_00 + 8);
  }
  if (puVar5 != puVar2) {
    *(pointer *)(this_00 + 8) = puVar2;
  }
  pOVar3 = (local_48->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(local_48->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
          -0x5555555555555555;
  if ((int)uVar6 != 0) {
    lVar8 = 0;
    uVar7 = 0;
    this_01 = local_48;
    do {
      if (uVar6 <= uVar7) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
      }
      uVar1 = *(uint *)((long)((pOVar3->words).buffer + 0xfffffffffffffffa) + lVar8);
      if ((uVar1 < 6) && ((0x36U >> (uVar1 & 0x1f) & 1) != 0)) {
        local_4c = Instruction::GetSingleWordOperand(this_01,(uint32_t)uVar7);
        local_40.def = (Instruction *)CONCAT44(local_40.def._4_4_,local_4c);
        iVar4 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,(key_type_conflict *)&local_40);
        if ((iVar4.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
             ._M_cur == (__node_type *)0x0) ||
           (*(Instruction **)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                    ._M_cur + 0x10) == (Instruction *)0x0)) {
          __assert_fail("def && \"Definition is not registered.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                        ,0x38,
                        "void spvtools::opt::analysis::DefUseManager::AnalyzeInstUse(Instruction *)"
                       );
        }
        local_40.user = local_48;
        local_40.def = *(Instruction **)
                        ((long)iVar4.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                               ._M_cur + 0x10);
        std::
        _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
        ::_M_insert_unique<spvtools::opt::analysis::UserEntry>(&(this->id_to_users_)._M_t,&local_40)
        ;
        __position._M_current = *(uint **)(this_00 + 8);
        if (__position._M_current == *(uint **)(this_00 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_4c);
          this_01 = local_48;
        }
        else {
          *__position._M_current = local_4c;
          *(uint **)(this_00 + 8) = __position._M_current + 1;
          this_01 = local_48;
        }
      }
      uVar7 = uVar7 + 1;
      pOVar3 = (this_01->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this_01->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
              -0x5555555555555555;
      lVar8 = lVar8 + 0x30;
    } while (uVar7 < (uVar6 & 0xffffffff));
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeInstUse(Instruction* inst) {
  // Create entry for the given instruction. Note that the instruction may
  // not have any in-operands. In such cases, we still need a entry for those
  // instructions so this manager knows it has seen the instruction later.
  auto* used_ids = &inst_to_used_ids_[inst];
  if (used_ids->size()) {
    EraseUseRecordsOfOperandIds(inst);
    used_ids = &inst_to_used_ids_[inst];
  }
  used_ids->clear();  // It might have existed before.

  for (uint32_t i = 0; i < inst->NumOperands(); ++i) {
    switch (inst->GetOperand(i).type) {
      // For any id type but result id type
      case SPV_OPERAND_TYPE_ID:
      case SPV_OPERAND_TYPE_TYPE_ID:
      case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      case SPV_OPERAND_TYPE_SCOPE_ID: {
        uint32_t use_id = inst->GetSingleWordOperand(i);
        Instruction* def = GetDef(use_id);
        assert(def && "Definition is not registered.");
        id_to_users_.insert(UserEntry{def, inst});
        used_ids->push_back(use_id);
      } break;
      default:
        break;
    }
  }
}